

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O3

void __thiscall CTemporaryLabelTable::CTemporaryLabelTable(CTemporaryLabelTable *this)

{
  (this->labels).super__Vector_base<TemporaryLabel,_std::allocator<TemporaryLabel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->labels).super__Vector_base<TemporaryLabel,_std::allocator<TemporaryLabel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->labels).super__Vector_base<TemporaryLabel,_std::allocator<TemporaryLabel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<TemporaryLabel,_std::allocator<TemporaryLabel>_>::reserve(&this->labels,0x80);
  this->refresh = 0;
  return;
}

Assistant:

CTemporaryLabelTable::CTemporaryLabelTable() {
	labels.reserve(128);
	refresh = 0;
}